

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_BaseModel.cpp
# Opt level: O0

bool __thiscall Opcode::BaseModel::CreateTree(BaseModel *this,bool no_leaf,bool quantized)

{
  AABBQuantizedNoLeafTree *this_00;
  AABBNoLeafTree *this_01;
  AABBQuantizedTree *this_02;
  AABBCollisionTree *this_03;
  bool quantized_local;
  bool no_leaf_local;
  BaseModel *this_local;
  
  if (this->mTree != (AABBOptimizedTree *)0x0) {
    if (this->mTree != (AABBOptimizedTree *)0x0) {
      (*this->mTree->_vptr_AABBOptimizedTree[1])();
    }
    this->mTree = (AABBOptimizedTree *)0x0;
  }
  if (no_leaf) {
    this->mModelCode = this->mModelCode | 2;
  }
  else {
    this->mModelCode = this->mModelCode & 0xfffffffd;
  }
  if (quantized) {
    this->mModelCode = this->mModelCode | 1;
  }
  else {
    this->mModelCode = this->mModelCode & 0xfffffffe;
  }
  if ((this->mModelCode & 2) == 0) {
    if ((this->mModelCode & 1) == 0) {
      this_03 = (AABBCollisionTree *)operator_new(0x18);
      AABBCollisionTree::AABBCollisionTree(this_03);
      this->mTree = (AABBOptimizedTree *)this_03;
    }
    else {
      this_02 = (AABBQuantizedTree *)operator_new(0x30);
      AABBQuantizedTree::AABBQuantizedTree(this_02);
      this->mTree = (AABBOptimizedTree *)this_02;
    }
  }
  else if ((this->mModelCode & 1) == 0) {
    this_01 = (AABBNoLeafTree *)operator_new(0x18);
    AABBNoLeafTree::AABBNoLeafTree(this_01);
    this->mTree = (AABBOptimizedTree *)this_01;
  }
  else {
    this_00 = (AABBQuantizedNoLeafTree *)operator_new(0x30);
    AABBQuantizedNoLeafTree::AABBQuantizedNoLeafTree(this_00);
    this->mTree = (AABBOptimizedTree *)this_00;
  }
  return this->mTree != (AABBOptimizedTree *)0x0;
}

Assistant:

bool BaseModel::CreateTree(bool no_leaf, bool quantized)
{
	DELETESINGLE(mTree);

	// Setup model code
	if(no_leaf)		mModelCode |= OPC_NO_LEAF;
	else			mModelCode &= ~OPC_NO_LEAF;

	if(quantized)	mModelCode |= OPC_QUANTIZED;
	else			mModelCode &= ~OPC_QUANTIZED;

	// Create the correct class
	if(mModelCode & OPC_NO_LEAF)
	{
		if(mModelCode & OPC_QUANTIZED)	mTree = new AABBQuantizedNoLeafTree;
		else							mTree = new AABBNoLeafTree;
	}
	else
	{
		if(mModelCode & OPC_QUANTIZED)	mTree = new AABBQuantizedTree;
		else							mTree = new AABBCollisionTree;
	}
	CHECKALLOC(mTree);

	return true;
}